

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

optional<std::pair<unsigned_int,_unsigned_int>_>
metaf::fractionStrToUint(string *str,size_t startPos,size_t length)

{
  _Storage<std::pair<unsigned_int,_unsigned_int>,_true> _Var1;
  optional<unsigned_int> oVar2;
  _Storage<std::pair<unsigned_int,_unsigned_int>,_true> _Var3;
  undefined4 uVar4;
  size_t digits;
  size_t sVar5;
  ulong digits_00;
  optional<std::pair<unsigned_int,_unsigned_int>_> oVar6;
  
  sVar5 = str->_M_string_length - startPos;
  if (length + startPos <= str->_M_string_length) {
    sVar5 = length;
  }
  _Var1 = (_Storage<std::pair<unsigned_int,_unsigned_int>,_true>)
          std::__cxx11::string::find((char)str,0x2f);
  _Var3 = _Var1;
  if (_Var1 != (_Storage<std::pair<unsigned_int,_unsigned_int>,_true>)0xffffffffffffffff) {
    digits = (long)_Var1 - startPos;
    _Var3._1_7_ = _Var1._1_7_;
    _Var3._M_value.first._0_1_ = digits == 0;
    if (digits < 3 && digits != 0) {
      digits_00 = (sVar5 + startPos) - ((long)_Var1 + 1U);
      _Var3._M_value.first._0_1_ = digits_00 == 0;
      if (digits_00 < 3 && digits_00 != 0) {
        oVar2 = strToUint(str,startPos,digits);
        _Var3._M_value = (pair<unsigned_int,_unsigned_int>)strToUint(str,(long)_Var1 + 1U,digits_00)
        ;
        uVar4 = 0;
        if ((((ulong)oVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_int> >> 0x20 & 1) != 0) &&
           (((ulong)_Var3 & 0x100000000) != 0)) {
          _Var3 = (_Storage<std::pair<unsigned_int,_unsigned_int>,_true>)
                  ((ulong)oVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                          super__Optional_payload_base<unsigned_int> & 0xffffffff |
                  (long)_Var3 << 0x20);
          uVar4 = 1;
        }
        goto LAB_0018a41e;
      }
    }
  }
  uVar4 = 0;
LAB_0018a41e:
  oVar6.super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>._M_payload.
  super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>._8_4_ = uVar4;
  oVar6.super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>._M_payload.
  super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>._M_payload = _Var3;
  return (optional<std::pair<unsigned_int,_unsigned_int>_>)
         oVar6.super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>._M_payload.
         super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>;
}

Assistant:

std::optional<std::pair<unsigned int, unsigned int> >
	fractionStrToUint(const std::string & str,
		std::size_t startPos,
		std::size_t length)
{
	//Equivalent regex "(\\d\\d?)/(\\d\\d?)"
	std::optional<std::pair<unsigned int, unsigned int> > error;
	if (length + startPos > str.length()) length = str.length() - startPos;
	const std::size_t endPos = startPos + length;

	const auto slashPos = str.find('/', startPos);
	if (slashPos == std::string::npos) return error;

	static const int minDigits = 1, maxDigits = 2;

	const std::size_t numeratorPos = startPos;
	const std::size_t numeratorLength = slashPos - startPos;
	if (numeratorLength < minDigits || numeratorLength > maxDigits) return error;
	const std::size_t denominatorPos = slashPos + 1;
	const std::size_t denominatorLength = endPos - denominatorPos;
	if (denominatorLength < minDigits || denominatorLength > maxDigits) return error;

	const auto numerator = strToUint(str, numeratorPos, numeratorLength);
	const auto denominator = strToUint(str, denominatorPos, denominatorLength);
	if (!numerator.has_value() || !denominator.has_value()) return error;
	return std::pair(*numerator, *denominator);
}